

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::disposeImpl
          (DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *this,void *pointer)

{
  if (*(long *)((long)pointer + 0xb8) != 0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)((long)pointer + 0xb0));
  }
  if (*(char *)((long)pointer + 0x40) == '\x01') {
    if (*(int *)((long)pointer + 0x48) == 1) {
      *(undefined4 *)((long)pointer + 0x48) = 0;
    }
    if (*(int *)((long)pointer + 0x48) == 2) {
      *(undefined4 *)((long)pointer + 0x48) = 0;
    }
  }
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    reinterpret_cast<T*>(pointer)->~T();
  }